

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

void imdct_step3_inner_r_loop(int lim,float *e,int d0,int k_off,float *A,int k1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float *e2;
  float *e0;
  float k01_21;
  float k00_20;
  int i;
  int k1_local;
  float *A_local;
  int k_off_local;
  int d0_local;
  float *e_local;
  int lim_local;
  
  e0 = e + d0;
  e2 = e0 + k_off;
  A_local = A;
  for (i = lim >> 2; 0 < i; i = i + -1) {
    fVar1 = *e0;
    fVar2 = *e2;
    fVar3 = e0[-1];
    fVar4 = e2[-1];
    *e0 = *e2 + *e0;
    e0[-1] = e2[-1] + e0[-1];
    *e2 = (fVar1 - fVar2) * *A_local + -((fVar3 - fVar4) * A_local[1]);
    e2[-1] = (fVar3 - fVar4) * *A_local + (fVar1 - fVar2) * A_local[1];
    pfVar5 = A_local + k1;
    fVar1 = e0[-2];
    fVar2 = e2[-2];
    fVar3 = e0[-3];
    fVar4 = e2[-3];
    e0[-2] = e2[-2] + e0[-2];
    e0[-3] = e2[-3] + e0[-3];
    e2[-2] = (fVar1 - fVar2) * *pfVar5 + -((fVar3 - fVar4) * pfVar5[1]);
    e2[-3] = (fVar3 - fVar4) * *pfVar5 + (fVar1 - fVar2) * pfVar5[1];
    pfVar5 = pfVar5 + k1;
    fVar1 = e0[-4];
    fVar2 = e2[-4];
    fVar3 = e0[-5];
    fVar4 = e2[-5];
    e0[-4] = e2[-4] + e0[-4];
    e0[-5] = e2[-5] + e0[-5];
    e2[-4] = (fVar1 - fVar2) * *pfVar5 + -((fVar3 - fVar4) * pfVar5[1]);
    e2[-5] = (fVar3 - fVar4) * *pfVar5 + (fVar1 - fVar2) * pfVar5[1];
    pfVar5 = pfVar5 + k1;
    fVar1 = e0[-6];
    fVar2 = e2[-6];
    fVar3 = e0[-7];
    fVar4 = e2[-7];
    e0[-6] = e2[-6] + e0[-6];
    e0[-7] = e2[-7] + e0[-7];
    e2[-6] = (fVar1 - fVar2) * *pfVar5 + -((fVar3 - fVar4) * pfVar5[1]);
    e2[-7] = (fVar3 - fVar4) * *pfVar5 + (fVar1 - fVar2) * pfVar5[1];
    e0 = e0 + -8;
    e2 = e2 + -8;
    A_local = pfVar5 + k1;
  }
  return;
}

Assistant:

static void imdct_step3_inner_r_loop(int lim, float *e, int d0, int k_off, float *A, int k1)
{
   int i;
   float k00_20, k01_21;

   float *e0 = e + d0;
   float *e2 = e0 + k_off;

   for (i=lim >> 2; i > 0; --i) {
      k00_20 = e0[-0] - e2[-0];
      k01_21 = e0[-1] - e2[-1];
      e0[-0] += e2[-0];//e0[-0] = e0[-0] + e2[-0];
      e0[-1] += e2[-1];//e0[-1] = e0[-1] + e2[-1];
      e2[-0] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-1] = (k01_21)*A[0] + (k00_20) * A[1];

      A += k1;

      k00_20 = e0[-2] - e2[-2];
      k01_21 = e0[-3] - e2[-3];
      e0[-2] += e2[-2];//e0[-2] = e0[-2] + e2[-2];
      e0[-3] += e2[-3];//e0[-3] = e0[-3] + e2[-3];
      e2[-2] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-3] = (k01_21)*A[0] + (k00_20) * A[1];

      A += k1;

      k00_20 = e0[-4] - e2[-4];
      k01_21 = e0[-5] - e2[-5];
      e0[-4] += e2[-4];//e0[-4] = e0[-4] + e2[-4];
      e0[-5] += e2[-5];//e0[-5] = e0[-5] + e2[-5];
      e2[-4] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-5] = (k01_21)*A[0] + (k00_20) * A[1];

      A += k1;

      k00_20 = e0[-6] - e2[-6];
      k01_21 = e0[-7] - e2[-7];
      e0[-6] += e2[-6];//e0[-6] = e0[-6] + e2[-6];
      e0[-7] += e2[-7];//e0[-7] = e0[-7] + e2[-7];
      e2[-6] = (k00_20)*A[0] - (k01_21) * A[1];
      e2[-7] = (k01_21)*A[0] + (k00_20) * A[1];

      e0 -= 8;
      e2 -= 8;

      A += k1;
   }
}